

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::lossToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,loss_name ln)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (ln == softmax) {
    pcVar2 = "softmax";
    paVar1 = &local_b;
  }
  else if (ln == ns) {
    pcVar2 = "ns";
    paVar1 = &local_a;
  }
  else if (ln == hs) {
    pcVar2 = "hs";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "Unknown loss!";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::lossToString(loss_name ln) const {
  switch (ln) {
    case loss_name::hs:
      return "hs";
    case loss_name::ns:
      return "ns";
    case loss_name::softmax:
      return "softmax";
  }
  return "Unknown loss!"; // should never happen
}